

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator_for_node.hpp
# Opt level: O3

void __thiscall
ranger::bhvr_tree::
decorator_for_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
::exec_impl(decorator_for_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
            *this,agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
                  *ap,
           abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
           *node,size_t count,bool current,handler_type *hdl)

{
  handler_type *this_00;
  function<void(bool,test_agent*)> local_80 [16];
  code *local_70;
  anon_class_72_6_9066e0fc local_60;
  
  if (count != 0) {
    this_00 = &local_60.hdl;
    local_60.ap = ap;
    local_60.this = this;
    local_60.node = node;
    local_60.count = count;
    local_60.current = current;
    std::function<void_(bool,_test_agent_*)>::function(this_00,hdl);
    std::function<void(bool,test_agent*)>::
    function<ranger::bhvr_tree::decorator_for_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>::exec_impl(ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>&,ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>*,unsigned_long,bool,std::function<void(bool,test_agent*)>)const::_lambda(bool,test_agent*)_1_,void>
              (local_80,&local_60);
    (*node->_vptr_abstract_node[2])(node,ap,local_80);
    if (local_70 != (code *)0x0) {
      (*local_70)(local_80,local_80,3);
    }
    if (local_60.hdl.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_60.hdl.super__Function_base._M_manager)
                ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
    }
    return;
  }
  std::function<void_(bool,_test_agent_*)>::operator()(hdl,current,ap->m_agent);
  return;
}

Assistant:

void exec_impl(AgentProxy& ap,
                 abstract_node<AgentProxy>* node,
                 size_t count,
                 bool current,
                 typename AgentProxy::handler_type hdl) const {
    if (count > 0) {
      node->exec(ap, [=, &ap] (bool result, typename AgentProxy::agent_type*) {
        exec_impl(ap, node, count - 1, current || result, std::move(hdl));
      });
    } else {
      ap(hdl, current);
    }
  }